

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

int32_t get_inter_cost(AV1_COMP *cpi,MACROBLOCKD *xd,uint8_t *src_mb_buffer,int src_stride,
                      TplBuffers *tpl_tmp_buffers,BLOCK_SIZE bsize,TX_SIZE tx_size,int mi_row,
                      int mi_col,int rf_idx,MV *rfidx_mv,int use_pred_sad)

{
  BitDepthInfo bd_info_00;
  BitDepthInfo bd_info_01;
  int iVar1;
  int iVar2;
  int iVar3;
  FULLPEL_MV FVar4;
  long lVar5;
  undefined4 in_ECX;
  undefined8 in_RDX;
  MACROBLOCKD *in_RSI;
  long *in_RDI;
  ulong *in_R8;
  byte in_R9B;
  byte in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  MV *in_stack_00000028;
  int in_stack_00000030;
  FULLPEL_MV fullmv;
  int ref_stride;
  uint8_t *ref_mb;
  int ref_mb_offset;
  InterPredParams inter_pred_params;
  buf_2d ref_buf;
  uint8_t *predictor;
  uint8_t *predictor8;
  int_interpfilters kernel;
  int32_t inter_cost;
  int bh;
  int bw;
  tran_low_t *coeff;
  int16_t *src_diff;
  YV12_BUFFER_CONFIG *ref_frame_ptr;
  TplParams *tpl_data;
  BitDepthInfo bd_info;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffddc;
  undefined8 in_stack_fffffffffffffde0;
  undefined4 uVar7;
  MV *src_mv;
  int in_stack_fffffffffffffdec;
  int in_stack_fffffffffffffdf4;
  undefined8 in_stack_fffffffffffffdf8;
  int subsampling_x;
  undefined8 in_stack_fffffffffffffe00;
  undefined8 *puVar8;
  int src_stride_00;
  undefined4 in_stack_fffffffffffffe08;
  int_interpfilters iVar9;
  int in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  undefined4 in_stack_fffffffffffffe18;
  int iVar10;
  undefined4 in_stack_fffffffffffffe1c;
  int_interpfilters interp_filters;
  int in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  int in_stack_fffffffffffffe30;
  int subsampling_y;
  ulong uVar11;
  undefined2 in_stack_fffffffffffffe38;
  undefined2 in_stack_fffffffffffffe3a;
  undefined4 in_stack_fffffffffffffe3c;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe48;
  TX_SIZE in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe51;
  buf_2d *in_stack_fffffffffffffe58;
  undefined1 auStack_150 [168];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  ulong local_88;
  ulong local_80;
  int_interpfilters local_78;
  int32_t local_74;
  int_interpfilters local_70;
  int local_6c;
  ulong local_68;
  ulong local_60;
  undefined4 *local_58;
  long local_50;
  BitDepthInfo local_44;
  byte local_39;
  ulong *local_38;
  undefined4 local_2c;
  undefined8 local_28;
  MACROBLOCKD *local_20;
  long *local_18;
  
  uVar7 = (undefined4)((ulong)in_stack_fffffffffffffde0 >> 0x20);
  iVar1 = (int)((ulong)in_stack_fffffffffffffe00 >> 0x20);
  uVar6 = (undefined4)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  local_39 = in_R9B;
  local_38 = in_R8;
  local_2c = in_ECX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  local_44 = get_bit_depth_info((MACROBLOCKD *)
                                CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  local_50 = *local_18 + 0xd2a8;
  local_58 = *(undefined4 **)(*local_18 + 0x122b8 + (long)in_stack_00000020 * 8);
  local_60 = local_38[1];
  local_68 = local_38[2];
  local_6c = 4 << (""[local_39] & 0x1f);
  local_70.as_int = 4 << (""[local_39] & 0x1f);
  if (*(char *)((long)local_18 + 0x60914) == '\x03') {
    lVar5 = *(long *)(local_58 + 10) +
            (long)(in_stack_00000010 * 4 * local_58[8] + in_stack_00000018 * 4);
    iVar10 = local_58[8];
    FVar4 = get_fullmv_from_mv(in_stack_00000028);
    if (in_stack_00000030 == 0) {
      bd_info_01.use_highbitdepth_buf = in_stack_fffffffffffffe24;
      bd_info_01.bit_depth = in_stack_fffffffffffffe20;
      local_74 = tpl_get_satd_cost(bd_info_01,
                                   (int16_t *)
                                   CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                                   in_stack_fffffffffffffe14,
                                   (uint8_t *)
                                   CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                                   iVar1,(uint8_t *)CONCAT44(uVar6,(uint)in_stack_00000008),
                                   in_stack_fffffffffffffe30,(tran_low_t *)CONCAT44(iVar10,FVar4),
                                   (int)lVar5,in_stack_fffffffffffffe48,in_stack_fffffffffffffe50);
    }
    else {
      local_74 = (**(code **)(*local_18 + 0xc900 + (ulong)local_39 * 0x70))
                           (local_28,local_2c,lVar5 + (FVar4.row * iVar10 + (int)FVar4.col),iVar10);
    }
  }
  else {
    local_78 = av1_broadcast_interp_filter(EIGHTTAP_REGULAR);
    local_80 = *local_38;
    iVar1 = is_cur_buf_hbd(local_20);
    uVar11 = local_80;
    if (iVar1 != 0) {
      uVar11 = local_80 >> 1;
    }
    local_a8 = 0;
    local_a0 = *(undefined8 *)(local_58 + 10);
    local_98 = *local_58;
    local_94 = local_58[2];
    local_90 = local_58[8];
    iVar2 = in_stack_00000010 << 2;
    iVar3 = in_stack_00000018 << 2;
    iVar1 = local_20->bd;
    iVar10 = local_6c;
    interp_filters = local_70;
    local_88 = uVar11;
    is_cur_buf_hbd(local_20);
    puVar8 = &local_a8;
    uVar6 = 0;
    src_mv = (MV *)CONCAT44(uVar7,iVar1);
    iVar1 = 0;
    subsampling_x = (int)((ulong)(local_50 + 0x4ff8) >> 0x20);
    subsampling_y = (int)uVar11;
    iVar9 = local_78;
    av1_init_inter_params
              ((InterPredParams *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
               in_stack_fffffffffffffe0c,local_78.as_int,(int)((ulong)puVar8 >> 0x20),(int)puVar8,
               subsampling_x,subsampling_y,
               CONCAT22(in_stack_fffffffffffffe3a,in_stack_fffffffffffffe38),
               in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
               (scale_factors *)CONCAT71(in_stack_fffffffffffffe51,in_stack_fffffffffffffe50),
               in_stack_fffffffffffffe58,interp_filters);
    src_stride_00 = (int)((ulong)puVar8 >> 0x20);
    get_conv_params(in_stack_fffffffffffffdf4,iVar1,in_stack_fffffffffffffdec);
    memcpy(auStack_150,&stack0xfffffffffffffe50,0x30);
    av1_enc_build_one_inter_predictor
              ((uint8_t *)CONCAT44(in_stack_fffffffffffffdf4,iVar1),in_stack_fffffffffffffdec,src_mv
               ,(InterPredParams *)CONCAT44(in_stack_fffffffffffffddc,uVar6));
    if (in_stack_00000030 == 0) {
      bd_info_00.use_highbitdepth_buf = iVar3;
      bd_info_00.bit_depth = iVar2;
      local_74 = tpl_get_satd_cost(bd_info_00,(int16_t *)CONCAT44(interp_filters.as_int,iVar10),
                                   in_stack_fffffffffffffe14,
                                   (uint8_t *)CONCAT44(in_stack_fffffffffffffe0c,iVar9.as_int),
                                   src_stride_00,
                                   (uint8_t *)CONCAT44(subsampling_x,(uint)in_stack_00000008),
                                   subsampling_y,
                                   (tran_low_t *)
                                   CONCAT44(in_stack_fffffffffffffe3c,
                                            CONCAT22(in_stack_fffffffffffffe3a,
                                                     in_stack_fffffffffffffe38)),
                                   in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                                   in_stack_fffffffffffffe50);
    }
    else {
      local_74 = (**(code **)(*local_18 + 0xc900 + (ulong)local_39 * 0x70))
                           (local_28,local_2c,local_88,local_6c);
    }
  }
  return local_74;
}

Assistant:

static inline int32_t get_inter_cost(const AV1_COMP *cpi, MACROBLOCKD *xd,
                                     const uint8_t *src_mb_buffer,
                                     int src_stride,
                                     TplBuffers *tpl_tmp_buffers,
                                     BLOCK_SIZE bsize, TX_SIZE tx_size,
                                     int mi_row, int mi_col, int rf_idx,
                                     MV *rfidx_mv, int use_pred_sad) {
  const BitDepthInfo bd_info = get_bit_depth_info(xd);
  TplParams *tpl_data = &cpi->ppi->tpl_data;
  const YV12_BUFFER_CONFIG *const ref_frame_ptr =
      tpl_data->src_ref_frame[rf_idx];
  int16_t *src_diff = tpl_tmp_buffers->src_diff;
  tran_low_t *coeff = tpl_tmp_buffers->coeff;
  const int bw = 4 << mi_size_wide_log2[bsize];
  const int bh = 4 << mi_size_high_log2[bsize];
  int32_t inter_cost;

  if (cpi->sf.tpl_sf.subpel_force_stop != FULL_PEL) {
    const int_interpfilters kernel =
        av1_broadcast_interp_filter(EIGHTTAP_REGULAR);
    uint8_t *predictor8 = tpl_tmp_buffers->predictor8;
    uint8_t *predictor =
        is_cur_buf_hbd(xd) ? CONVERT_TO_BYTEPTR(predictor8) : predictor8;
    struct buf_2d ref_buf = { NULL, ref_frame_ptr->y_buffer,
                              ref_frame_ptr->y_width, ref_frame_ptr->y_height,
                              ref_frame_ptr->y_stride };
    InterPredParams inter_pred_params;
    av1_init_inter_params(&inter_pred_params, bw, bh, mi_row * MI_SIZE,
                          mi_col * MI_SIZE, 0, 0, xd->bd, is_cur_buf_hbd(xd), 0,
                          &tpl_data->sf, &ref_buf, kernel);
    inter_pred_params.conv_params = get_conv_params(0, 0, xd->bd);

    av1_enc_build_one_inter_predictor(predictor, bw, rfidx_mv,
                                      &inter_pred_params);

    if (use_pred_sad) {
      inter_cost = (int)cpi->ppi->fn_ptr[bsize].sdf(src_mb_buffer, src_stride,
                                                    predictor, bw);
    } else {
      inter_cost =
          tpl_get_satd_cost(bd_info, src_diff, bw, src_mb_buffer, src_stride,
                            predictor, bw, coeff, bw, bh, tx_size);
    }
  } else {
    int ref_mb_offset =
        mi_row * MI_SIZE * ref_frame_ptr->y_stride + mi_col * MI_SIZE;
    uint8_t *ref_mb = ref_frame_ptr->y_buffer + ref_mb_offset;
    int ref_stride = ref_frame_ptr->y_stride;
    const FULLPEL_MV fullmv = get_fullmv_from_mv(rfidx_mv);
    // Since sub-pel motion search is not performed, use the prediction pixels
    // directly from the reference block ref_mb
    if (use_pred_sad) {
      inter_cost = (int)cpi->ppi->fn_ptr[bsize].sdf(
          src_mb_buffer, src_stride,
          &ref_mb[fullmv.row * ref_stride + fullmv.col], ref_stride);
    } else {
      inter_cost =
          tpl_get_satd_cost(bd_info, src_diff, bw, src_mb_buffer, src_stride,
                            &ref_mb[fullmv.row * ref_stride + fullmv.col],
                            ref_stride, coeff, bw, bh, tx_size);
    }
  }
  return inter_cost;
}